

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O1

void __thiscall tinyjson::json_node::~json_node(json_node *this)

{
  size_t *psVar1;
  node_type nVar2;
  _List_node_base *p_Var3;
  pointer ppjVar4;
  json_node *pjVar5;
  array *paVar6;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
  *this_00;
  ulong uVar7;
  array *paVar8;
  pointer ppjVar9;
  
  nVar2 = this->type;
  if (nVar2 == object_type) {
    paVar6 = (this->storage).array_val;
    for (paVar8 = (array *)(paVar6->
                           super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start; paVar8 != paVar6;
        paVar8 = (array *)(paVar8->
                          super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                          )._M_impl.super__Vector_impl_data._M_start) {
      pjVar5 = (json_node *)
               paVar8[2].
               super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pjVar5 != (json_node *)0x0) {
        ~json_node(pjVar5);
        operator_delete(pjVar5,0x10);
      }
    }
    this_00 = (_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
               *)(this->storage).array_val;
    if (this_00 ==
        (_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
         *)0x0) {
      return;
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(this_00 + 1));
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
    ::_M_clear(this_00);
    uVar7 = 0x50;
  }
  else if (nVar2 == array_type) {
    ppjVar4 = (((this->storage).array_val)->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppjVar9 = (((this->storage).array_val)->
                   super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppjVar9 != ppjVar4;
        ppjVar9 = ppjVar9 + 1) {
      pjVar5 = *ppjVar9;
      if (pjVar5 != (json_node *)0x0) {
        ~json_node(pjVar5);
        operator_delete(pjVar5,0x10);
      }
    }
    this_00 = (_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
               *)(this->storage).array_val;
    if (this_00 ==
        (_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
         *)0x0) {
      return;
    }
    p_Var3 = (this_00->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)0x0) {
      operator_delete(p_Var3,(this_00->_M_impl)._M_node._M_size - (long)p_Var3);
    }
    uVar7 = 0x18;
  }
  else {
    if ((nVar2 != string_type) ||
       (this_00 = (_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                   *)(this->storage).array_val,
       this_00 ==
       (_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
        *)0x0)) {
      return;
    }
    p_Var3 = (this_00->_M_impl)._M_node.super__List_node_base._M_next;
    psVar1 = &(this_00->_M_impl)._M_node._M_size;
    if (p_Var3 != (_List_node_base *)psVar1) {
      operator_delete(p_Var3,*psVar1 + 1);
    }
    uVar7 = 0x20;
  }
  operator_delete(this_00,uVar7);
  return;
}

Assistant:

~json_node() {
      clear();
    }